

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O2

void __thiscall uint256_tests::basics::test_method(basics *this)

{
  uint uVar1;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  string *psVar4;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  string_view str;
  const_string file_20;
  string_view str_00;
  const_string file_21;
  string_view str_01;
  const_string file_22;
  string_view str_02;
  const_string file_23;
  string_view str_03;
  const_string file_24;
  string_view str_04;
  const_string file_25;
  string_view str_05;
  const_string file_26;
  string_view str_06;
  const_string file_27;
  string_view str_07;
  const_string file_28;
  const_string file_29;
  string_view str_08;
  const_string file_30;
  string_view str_09;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  string_view str_20;
  char *local_a08;
  char *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined1 *local_998;
  undefined1 *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  undefined1 *local_968;
  undefined1 *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  undefined1 *local_938;
  undefined1 *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  undefined1 *local_878;
  undefined1 *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined **local_f8;
  undefined1 local_f0;
  undefined1 *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  undefined1 **ppuVar2;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_c0 = "";
  ppuVar2 = &local_d8;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4b;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar2,msg);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_100 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)R1L);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)R1Array,(uchar *)0x20,uVar1);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_108,0x4b,1,2,psVar4,"R1L.ToString()",&local_78,
             "ArrayToString(R1Array,32)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_110 = "";
  ppuVar2 = &local_128;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4c;
  file_00.m_begin = (iterator)&local_118;
  msg_00.m_end = (iterator)psVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppuVar2,msg_00);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_130 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_58,R1S);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)R1Array,(uchar *)0x14,uVar1);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_138,0x4c,1,2,psVar4,"R1S.ToString()",&local_78,
             "ArrayToString(R1Array,20)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_140 = "";
  ppuVar2 = &local_158;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4d;
  file_01.m_begin = (iterator)&local_148;
  msg_01.m_end = (iterator)psVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar2,msg_01);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)R2L);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)R2Array,(uchar *)0x20,uVar1);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_168,0x4d,1,2,psVar4,"R2L.ToString()",&local_78,
             "ArrayToString(R2Array,32)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_170 = "";
  ppuVar2 = &local_188;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4e;
  file_02.m_begin = (iterator)&local_178;
  msg_02.m_end = (iterator)psVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar2,msg_02);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_190 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_58,R2S);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)R2Array,(uchar *)0x14,uVar1);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_198,0x4e,1,2,psVar4,"R2S.ToString()",&local_78,
             "ArrayToString(R2Array,20)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1a0 = "";
  ppuVar2 = &local_1b8;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x4f;
  file_03.m_begin = (iterator)&local_1a8;
  msg_03.m_end = (iterator)psVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)ppuVar2,msg_03);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1c0 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)ZeroL);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)ZeroArray,(uchar *)0x20,uVar1);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_1c8,0x4f,1,2,psVar4,"ZeroL.ToString()",&local_78,
             "ArrayToString(ZeroArray,32)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1d0 = "";
  ppuVar2 = &local_1e8;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = &DAT_00000050;
  file_04.m_begin = (iterator)&local_1d8;
  msg_04.m_end = (iterator)psVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)ppuVar2,msg_04);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1f0 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_58,ZeroS);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)ZeroArray,(uchar *)0x14,uVar1);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_1f8,0x50,1,2,psVar4,"ZeroS.ToString()",&local_78,
             "ArrayToString(ZeroArray,20)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_200 = "";
  ppuVar2 = &local_218;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x51;
  file_05.m_begin = (iterator)&local_208;
  msg_05.m_end = (iterator)psVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)ppuVar2,msg_05);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_220 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)OneL);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)OneArray,(uchar *)0x20,uVar1);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_228,0x51,1,2,psVar4,"OneL.ToString()",&local_78,
             "ArrayToString(OneArray,32)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_230 = "";
  ppuVar2 = &local_248;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x52;
  file_06.m_begin = (iterator)&local_238;
  msg_06.m_end = (iterator)psVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)ppuVar2,msg_06);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_250 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_58,OneS);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)OneArray,(uchar *)0x14,uVar1);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_258,0x52,1,2,psVar4,"OneS.ToString()",&local_78,
             "ArrayToString(OneArray,20)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_260 = "";
  ppuVar2 = &local_278;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x53;
  file_07.m_begin = (iterator)&local_268;
  msg_07.m_end = (iterator)psVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)ppuVar2,msg_07);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_280 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)MaxL);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)MaxArray,(uchar *)0x20,uVar1);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_288,0x53,1,2,psVar4,"MaxL.ToString()",&local_78,
             "ArrayToString(MaxArray,32)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_290 = "";
  ppuVar2 = &local_2a8;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x54;
  file_08.m_begin = (iterator)&local_298;
  msg_08.m_end = (iterator)psVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)ppuVar2,msg_08);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2b0 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_58,MaxS);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)MaxArray,(uchar *)0x14,uVar1);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_2b8,0x54,1,2,psVar4,"MaxS.ToString()",&local_78,
             "ArrayToString(MaxArray,20)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2c0 = "";
  ppuVar2 = &local_2d8;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x55;
  file_09.m_begin = (iterator)&local_2c8;
  msg_09.m_end = (iterator)psVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)ppuVar2,msg_09);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2e0 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)OneL);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)ZeroArray,(uchar *)0x20,uVar1);
  pvVar3 = (iterator)0x3;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_2e8,0x55,1,3,psVar4,"OneL.ToString()",&local_78,
             "ArrayToString(ZeroArray,32)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2f0 = "";
  ppuVar2 = &local_308;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x56;
  file_10.m_begin = (iterator)&local_2f8;
  msg_10.m_end = (iterator)psVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)ppuVar2,msg_10);
  uVar1 = (uint)ppuVar2;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_310 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_58,OneS);
  ArrayToString_abi_cxx11_(&local_78,(uint256_tests *)ZeroArray,(uchar *)0x14,uVar1);
  pvVar3 = (iterator)0x3;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_318,0x56,1,3,psVar4,"OneS.ToString()",&local_78,
             "ArrayToString(ZeroArray,20)");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x59;
  file_11.m_begin = (iterator)&local_328;
  msg_11.m_end = (iterator)psVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_338,
             msg_11);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_340 = "";
  puVar5 = R1L;
  pvVar3 = (iterator)0x3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
            (&local_f8,&local_348,0x59,1,3,R1L,"R1L",R2L,"R2L");
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x59;
  file_12.m_begin = (iterator)&local_358;
  msg_12.m_end = puVar5;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_368,
             msg_12);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_370 = "";
  puVar5 = R1S;
  pvVar3 = (iterator)0x3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
            (&local_f8,&local_378,0x59,1,3,R1S,"R1S",R2S,"R2S");
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x5a;
  file_13.m_begin = (iterator)&local_388;
  msg_13.m_end = puVar5;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_398,
             msg_13);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_3a0 = "";
  pvVar3 = (iterator)0x3;
  puVar5 = ZeroL;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
            (&local_f8,&local_3a8,0x5a,1,3,ZeroL,"ZeroL",OneL,"OneL");
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x5a;
  file_14.m_begin = (iterator)&local_3b8;
  msg_14.m_end = puVar5;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3c8,
             msg_14);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_3d0 = "";
  pvVar3 = (iterator)0x3;
  puVar5 = ZeroS;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
            (&local_f8,&local_3d8,0x5a,1,3,ZeroS,"ZeroS",OneS,"OneS");
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x5b;
  file_15.m_begin = (iterator)&local_3e8;
  msg_15.m_end = puVar5;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3f8,
             msg_15);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_400 = "";
  pvVar3 = (iterator)0x3;
  puVar5 = OneL;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
            (&local_f8,&local_408,0x5b,1,3,OneL,"OneL",ZeroL,"ZeroL");
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x5b;
  file_16.m_begin = (iterator)&local_418;
  msg_16.m_end = puVar5;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_428,
             msg_16);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_430 = "";
  pvVar3 = (iterator)0x3;
  puVar5 = OneS;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
            (&local_f8,&local_438,0x5b,1,3,OneS,"OneS",ZeroS,"ZeroS");
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x5c;
  file_17.m_begin = (iterator)&local_448;
  msg_17.m_end = puVar5;
  msg_17.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_458,
             msg_17);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_460 = "";
  puVar5 = MaxL;
  pvVar3 = (iterator)0x3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
            (&local_f8,&local_468,0x5c,1,3,MaxL,"MaxL",ZeroL,"ZeroL");
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x5c;
  file_18.m_begin = (iterator)&local_478;
  msg_18.m_end = puVar5;
  msg_18.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_488,
             msg_18);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_490 = "";
  puVar5 = MaxS;
  pvVar3 = (iterator)0x3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint160,uint160>
            (&local_f8,&local_498,0x5c,1,3,MaxS,"MaxS",ZeroS,"ZeroS");
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x5f;
  file_19.m_begin = (iterator)&local_4a8;
  msg_19.m_end = puVar5;
  msg_19.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4b8,
             msg_19);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_4c0 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)R1L);
  std::operator+(&local_78,"0x",&local_98);
  str._M_str = local_78._M_dataplus._M_p;
  str._M_len = local_78._M_string_length;
  uint256S((uint256 *)&local_58,str);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_4c8,0x5f,1,2,psVar4,"uint256S(\"0x\"+R1L.ToString())",R1L,"R1L");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x60;
  file_20.m_begin = (iterator)&local_4d8;
  msg_20.m_end = (iterator)psVar4;
  msg_20.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4e8,
             msg_20);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_4f0 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)R2L);
  std::operator+(&local_78,"0x",&local_98);
  str_00._M_str = local_78._M_dataplus._M_p;
  str_00._M_len = local_78._M_string_length;
  uint256S((uint256 *)&local_58,str_00);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_4f8,0x60,1,2,psVar4,"uint256S(\"0x\"+R2L.ToString())",R2L,"R2L");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x61;
  file_21.m_begin = (iterator)&local_508;
  msg_21.m_end = (iterator)psVar4;
  msg_21.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_518,
             msg_21);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_520 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)ZeroL);
  std::operator+(&local_78,"0x",&local_98);
  str_01._M_str = local_78._M_dataplus._M_p;
  str_01._M_len = local_78._M_string_length;
  uint256S((uint256 *)&local_58,str_01);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_528,0x61,1,2,psVar4,"uint256S(\"0x\"+ZeroL.ToString())",ZeroL,"ZeroL")
  ;
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x62;
  file_22.m_begin = (iterator)&local_538;
  msg_22.m_end = (iterator)psVar4;
  msg_22.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_548,
             msg_22);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_550 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)OneL);
  std::operator+(&local_78,"0x",&local_98);
  str_02._M_str = local_78._M_dataplus._M_p;
  str_02._M_len = local_78._M_string_length;
  uint256S((uint256 *)&local_58,str_02);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_558,0x62,1,2,psVar4,"uint256S(\"0x\"+OneL.ToString())",OneL,"OneL");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x63;
  file_23.m_begin = (iterator)&local_568;
  msg_23.m_end = (iterator)psVar4;
  msg_23.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_578,
             msg_23);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_580 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)MaxL);
  std::operator+(&local_78,"0x",&local_98);
  str_03._M_str = local_78._M_dataplus._M_p;
  str_03._M_len = local_78._M_string_length;
  uint256S((uint256 *)&local_58,str_03);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_588,99,1,2,psVar4,"uint256S(\"0x\"+MaxL.ToString())",MaxL,"MaxL");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x64;
  file_24.m_begin = (iterator)&local_598;
  msg_24.m_end = (iterator)psVar4;
  msg_24.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_5a8,
             msg_24);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_5b0 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)R1L);
  str_04._M_str = local_78._M_dataplus._M_p;
  str_04._M_len = local_78._M_string_length;
  uint256S((uint256 *)&local_58,str_04);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_5b8,100,1,2,psVar4,"uint256S(R1L.ToString())",R1L,"R1L");
  std::__cxx11::string::~string((string *)&local_78);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x65;
  file_25.m_begin = (iterator)&local_5c8;
  msg_25.m_end = (iterator)psVar4;
  msg_25.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_5d8,
             msg_25);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_5e0 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_b8,(base_blob<256u> *)R1L);
  std::operator+(&local_98,"   0x",&local_b8);
  std::operator+(&local_78,&local_98,"   ");
  str_05._M_str = local_78._M_dataplus._M_p;
  str_05._M_len = local_78._M_string_length;
  uint256S((uint256 *)&local_58,str_05);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_5e8,0x65,1,2,psVar4,"uint256S(\"   0x\"+R1L.ToString()+\"   \")",R1L,
             "R1L");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x66;
  file_26.m_begin = (iterator)&local_5f8;
  msg_26.m_end = (iterator)psVar4;
  msg_26.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_608,
             msg_26);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_610 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_b8,(base_blob<256u> *)R1L);
  std::operator+(&local_98,"   0x",&local_b8);
  std::operator+(&local_78,&local_98,"-trash;%^&   ");
  str_06._M_str = local_78._M_dataplus._M_p;
  str_06._M_len = local_78._M_string_length;
  uint256S((uint256 *)&local_58,str_06);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_618,0x66,1,2,psVar4,
             "uint256S(\"   0x\"+R1L.ToString()+\"-trash;%^&   \")",R1L,"R1L");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x67;
  file_27.m_begin = (iterator)&local_628;
  msg_27.m_end = (iterator)psVar4;
  msg_27.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_638,
             msg_27);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_648 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_640 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_b8,(base_blob<256u> *)R1L);
  std::operator+(&local_98,"\t \n  \n \f\n\r\t\v\t   0x",&local_b8);
  std::operator+(&local_78,&local_98,"  \t \n  \n \f\n\r\t\v\t ");
  str_07._M_str = local_78._M_dataplus._M_p;
  str_07._M_len = local_78._M_string_length;
  uint256S((uint256 *)&local_58,str_07);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_648,0x67,1,2,psVar4,
             "uint256S(\"\\t \\n  \\n \\f\\n\\r\\t\\v\\t   0x\"+R1L.ToString()+\"  \\t \\n  \\n \\f\\n\\r\\t\\v\\t \")"
             ,R1L,"R1L");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  local_658 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = &DAT_00000068;
  file_28.m_begin = (iterator)&local_658;
  msg_28.m_end = (iterator)psVar4;
  msg_28.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_668,
             msg_28);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_670 = "";
  psVar4 = &local_58;
  uint256S((uint256 *)psVar4,(string_view)(ZEXT816(0xc7f1cc) << 0x40));
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_678,0x68,1,2,psVar4,"uint256S(\"\")",ZeroL,"ZeroL");
  local_688 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_680 = "";
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x69;
  file_29.m_begin = (iterator)&local_688;
  msg_29.m_end = (iterator)psVar4;
  msg_29.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_698,
             msg_29);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_6a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_6a0 = "";
  str_08._M_str = "1";
  str_08._M_len = 1;
  uint256S((uint256 *)&local_58,str_08);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_6a8,0x69,1,2,&local_58,"uint256S(\"1\")",OneL,"OneL");
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_6b0 = "";
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x6a;
  file_30.m_begin = (iterator)&local_6b8;
  msg_30.m_end = (iterator)psVar4;
  msg_30.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_6c8,
             msg_30);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_6d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_6d0 = "";
  str_09._M_str = R1ArrayHex;
  str_09._M_len = 0x40;
  uint256S((uint256 *)&local_58,str_09);
  pvVar3 = (iterator)0x2;
  puVar5 = R1L;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_6d8,0x6a,1,2,R1L,"R1L",&local_58,"uint256S(R1ArrayHex)");
  local_6e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_6e0 = "";
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x6b;
  file_31.m_begin = (iterator)&local_6e8;
  msg_31.m_end = puVar5;
  msg_31.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_6f8,
             msg_31);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_708 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_700 = "";
  local_58.field_2._M_allocated_capacity = R1L._16_8_;
  local_58.field_2._8_8_ = R1L._24_8_;
  local_58._M_dataplus._M_p._0_4_ = R1L._0_4_;
  local_58._M_dataplus._M_p._4_4_ = R1L._4_4_;
  local_58._M_string_length._0_4_ = R1L._8_4_;
  local_58._M_string_length._4_4_ = R1L._12_4_;
  psVar4 = &local_58;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_708,0x6b,1,2,psVar4,"uint256(R1L)",R1L,"R1L");
  local_718 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x6c;
  file_32.m_begin = (iterator)&local_718;
  msg_32.m_end = (iterator)psVar4;
  msg_32.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_728,
             msg_32);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_738 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_730 = "";
  local_58.field_2._M_allocated_capacity = ZeroL._16_8_;
  local_58.field_2._8_8_ = ZeroL._24_8_;
  local_58._M_dataplus._M_p._0_4_ = ZeroL._0_4_;
  local_58._M_dataplus._M_p._4_4_ = ZeroL._4_4_;
  local_58._M_string_length._0_4_ = ZeroL._8_4_;
  local_58._M_string_length._4_4_ = ZeroL._12_4_;
  psVar4 = &local_58;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_738,0x6c,1,2,psVar4,"uint256(ZeroL)",ZeroL,"ZeroL");
  local_748 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x6d;
  file_33.m_begin = (iterator)&local_748;
  msg_33.m_end = (iterator)psVar4;
  msg_33.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_758,
             msg_33);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_768 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_760 = "";
  local_58.field_2._M_allocated_capacity = OneL._16_8_;
  local_58.field_2._8_8_ = OneL._24_8_;
  local_58._M_dataplus._M_p._0_4_ = OneL._0_4_;
  local_58._M_dataplus._M_p._4_4_ = OneL._4_4_;
  local_58._M_string_length._0_4_ = OneL._8_4_;
  local_58._M_string_length._4_4_ = OneL._12_4_;
  psVar4 = &local_58;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_f8,&local_768,0x6d,1,2,psVar4,"uint256(OneL)",OneL,"OneL");
  local_778 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_770 = "";
  ppuVar2 = &local_788;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x6f;
  file_34.m_begin = (iterator)&local_778;
  msg_34.m_end = (iterator)psVar4;
  msg_34.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)ppuVar2,msg_34);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_798 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_790 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_78,R1S);
  std::operator+(&local_58,"0x",&local_78);
  str_10._M_len._4_4_ = local_58._M_dataplus._M_p._4_4_;
  str_10._M_len._0_4_ = local_58._M_dataplus._M_p._0_4_;
  str_10._M_str = (char *)ppuVar2;
  uint160S((uint160 *)&local_98,
           (uint256_tests *)
           CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length),str_10);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_798,0x6f,1,2,psVar4,"uint160S(\"0x\"+R1S.ToString())",R1S,"R1S");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_7a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_7a0 = "";
  ppuVar2 = &local_7b8;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x70;
  file_35.m_begin = (iterator)&local_7a8;
  msg_35.m_end = (iterator)psVar4;
  msg_35.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)ppuVar2,msg_35);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_7c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_7c0 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_78,R2S);
  std::operator+(&local_58,"0x",&local_78);
  str_11._M_len._4_4_ = local_58._M_dataplus._M_p._4_4_;
  str_11._M_len._0_4_ = local_58._M_dataplus._M_p._0_4_;
  str_11._M_str = (char *)ppuVar2;
  uint160S((uint160 *)&local_98,
           (uint256_tests *)
           CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length),str_11);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_7c8,0x70,1,2,psVar4,"uint160S(\"0x\"+R2S.ToString())",R2S,"R2S");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_7d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_7d0 = "";
  ppuVar2 = &local_7e8;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x71;
  file_36.m_begin = (iterator)&local_7d8;
  msg_36.m_end = (iterator)psVar4;
  msg_36.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)ppuVar2,msg_36);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_7f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_7f0 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_78,ZeroS);
  std::operator+(&local_58,"0x",&local_78);
  str_12._M_len._4_4_ = local_58._M_dataplus._M_p._4_4_;
  str_12._M_len._0_4_ = local_58._M_dataplus._M_p._0_4_;
  str_12._M_str = (char *)ppuVar2;
  uint160S((uint160 *)&local_98,
           (uint256_tests *)
           CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length),str_12);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_7f8,0x71,1,2,psVar4,"uint160S(\"0x\"+ZeroS.ToString())",ZeroS,"ZeroS")
  ;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_808 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_800 = "";
  ppuVar2 = &local_818;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x72;
  file_37.m_begin = (iterator)&local_808;
  msg_37.m_end = (iterator)psVar4;
  msg_37.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)ppuVar2,msg_37);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_820 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_78,OneS);
  std::operator+(&local_58,"0x",&local_78);
  str_13._M_len._4_4_ = local_58._M_dataplus._M_p._4_4_;
  str_13._M_len._0_4_ = local_58._M_dataplus._M_p._0_4_;
  str_13._M_str = (char *)ppuVar2;
  uint160S((uint160 *)&local_98,
           (uint256_tests *)
           CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length),str_13);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_828,0x72,1,2,psVar4,"uint160S(\"0x\"+OneS.ToString())",OneS,"OneS");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_838 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_830 = "";
  ppuVar2 = &local_848;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x73;
  file_38.m_begin = (iterator)&local_838;
  msg_38.m_end = (iterator)psVar4;
  msg_38.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)ppuVar2,msg_38);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_858 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_850 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_78,MaxS);
  std::operator+(&local_58,"0x",&local_78);
  str_14._M_len._4_4_ = local_58._M_dataplus._M_p._4_4_;
  str_14._M_len._0_4_ = local_58._M_dataplus._M_p._0_4_;
  str_14._M_str = (char *)ppuVar2;
  uint160S((uint160 *)&local_98,
           (uint256_tests *)
           CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length),str_14);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_858,0x73,1,2,psVar4,"uint160S(\"0x\"+MaxS.ToString())",MaxS,"MaxS");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_868 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_860 = "";
  ppuVar2 = &local_878;
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x74;
  file_39.m_begin = (iterator)&local_868;
  msg_39.m_end = (iterator)psVar4;
  msg_39.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)ppuVar2,msg_39);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_888 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_880 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_58,R1S);
  str_15._M_len._4_4_ = local_58._M_dataplus._M_p._4_4_;
  str_15._M_len._0_4_ = local_58._M_dataplus._M_p._0_4_;
  str_15._M_str = (char *)ppuVar2;
  uint160S((uint160 *)&local_78,
           (uint256_tests *)
           CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length),str_15);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_888,0x74,1,2,psVar4,"uint160S(R1S.ToString())",R1S,"R1S");
  std::__cxx11::string::~string((string *)&local_58);
  local_898 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_890 = "";
  ppuVar2 = &local_8a8;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x75;
  file_40.m_begin = (iterator)&local_898;
  msg_40.m_end = (iterator)psVar4;
  msg_40.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)ppuVar2,msg_40);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_8b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_8b0 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_98,R1S);
  std::operator+(&local_78,"   0x",&local_98);
  std::operator+(&local_58,&local_78,"   ");
  str_16._M_len._4_4_ = local_58._M_dataplus._M_p._4_4_;
  str_16._M_len._0_4_ = local_58._M_dataplus._M_p._0_4_;
  str_16._M_str = (char *)ppuVar2;
  uint160S((uint160 *)&local_b8,
           (uint256_tests *)
           CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length),str_16);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_8b8,0x75,1,2,psVar4,"uint160S(\"   0x\"+R1S.ToString()+\"   \")",R1S,
             "R1S");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  local_8c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_8c0 = "";
  ppuVar2 = &local_8d8;
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x76;
  file_41.m_begin = (iterator)&local_8c8;
  msg_41.m_end = (iterator)psVar4;
  msg_41.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)ppuVar2,msg_41);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_8e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_8e0 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_98,R1S);
  std::operator+(&local_78,"   0x",&local_98);
  std::operator+(&local_58,&local_78,"-trash;%^&   ");
  str_17._M_len._4_4_ = local_58._M_dataplus._M_p._4_4_;
  str_17._M_len._0_4_ = local_58._M_dataplus._M_p._0_4_;
  str_17._M_str = (char *)ppuVar2;
  uint160S((uint160 *)&local_b8,
           (uint256_tests *)
           CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length),str_17);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_8e8,0x76,1,2,psVar4,
             "uint160S(\"   0x\"+R1S.ToString()+\"-trash;%^&   \")",R1S,"R1S");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  local_8f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_8f0 = "";
  ppuVar2 = &local_908;
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x77;
  file_42.m_begin = (iterator)&local_8f8;
  msg_42.m_end = (iterator)psVar4;
  msg_42.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)ppuVar2,msg_42);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_918 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_910 = "";
  base_blob<160u>::ToString_abi_cxx11_(&local_98,R1S);
  std::operator+(&local_78," \t \n  \n \f\n\r\t\v\t  0x",&local_98);
  std::operator+(&local_58,&local_78,"   \t \n  \n \f\n\r\t\v\t");
  str_18._M_len._4_4_ = local_58._M_dataplus._M_p._4_4_;
  str_18._M_len._0_4_ = local_58._M_dataplus._M_p._0_4_;
  str_18._M_str = (char *)ppuVar2;
  uint160S((uint160 *)&local_b8,
           (uint256_tests *)
           CONCAT44(local_58._M_string_length._4_4_,(undefined4)local_58._M_string_length),str_18);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_918,0x77,1,2,psVar4,
             "uint160S(\" \\t \\n  \\n \\f\\n\\r\\t\\v\\t  0x\"+R1S.ToString()+\"   \\t \\n  \\n \\f\\n\\r\\t\\v\\t\")"
             ,R1S,"R1S");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  local_928 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_920 = "";
  ppuVar2 = &local_938;
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x78;
  file_43.m_begin = (iterator)&local_928;
  msg_43.m_end = (iterator)psVar4;
  msg_43.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)ppuVar2,msg_43);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_948 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_940 = "";
  str_19._M_str = (char *)ppuVar2;
  str_19._M_len = (size_t)"";
  uint160S((uint160 *)&local_58,(uint256_tests *)0x0,str_19);
  pvVar3 = (iterator)0x2;
  psVar4 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_948,0x78,1,2,&local_58,"uint160S(\"\")",ZeroS,"ZeroS");
  local_958 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_950 = "";
  ppuVar2 = &local_968;
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x79;
  file_44.m_begin = (iterator)&local_958;
  msg_44.m_end = (iterator)psVar4;
  msg_44.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)ppuVar2,msg_44);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_978 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_970 = "";
  str_20._M_str = (char *)ppuVar2;
  str_20._M_len = (size_t)R1ArrayHex;
  uint160S((uint160 *)&local_58,(uint256_tests *)0x40,str_20);
  pvVar3 = (iterator)0x2;
  puVar5 = R1S;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_978,0x79,1,2,R1S,"R1S",&local_58,"uint160S(R1ArrayHex)");
  local_988 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_980 = "";
  local_998 = &boost::unit_test::basic_cstring<char_const>::null;
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x7b;
  file_45.m_begin = (iterator)&local_988;
  msg_45.m_end = puVar5;
  msg_45.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_998,
             msg_45);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_9a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_9a0 = "";
  local_58.field_2._M_allocated_capacity._0_4_ = R1S._16_4_;
  local_58._M_dataplus._M_p._0_4_ = R1S._0_4_;
  local_58._M_dataplus._M_p._4_4_ = R1S._4_4_;
  local_58._M_string_length._0_4_ = R1S._8_4_;
  local_58._M_string_length._4_4_ = R1S._12_4_;
  psVar4 = &local_58;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_9a8,0x7b,1,2,psVar4,"uint160(R1S)",R1S,"R1S");
  local_9b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_9b0 = "";
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x7c;
  file_46.m_begin = (iterator)&local_9b8;
  msg_46.m_end = (iterator)psVar4;
  msg_46.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_9c8,
             msg_46);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_9d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_9d0 = "";
  local_58.field_2._M_allocated_capacity._0_4_ = ZeroS._16_4_;
  local_58._M_dataplus._M_p._0_4_ = ZeroS._0_4_;
  local_58._M_dataplus._M_p._4_4_ = ZeroS._4_4_;
  local_58._M_string_length._0_4_ = ZeroS._8_4_;
  local_58._M_string_length._4_4_ = ZeroS._12_4_;
  psVar4 = &local_58;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_9d8,0x7c,1,2,psVar4,"uint160(ZeroS)",ZeroS,"ZeroS");
  local_9e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_9e0 = "";
  local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x7d;
  file_47.m_begin = (iterator)&local_9e8;
  msg_47.m_end = (iterator)psVar4;
  msg_47.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_9f8,
             msg_47);
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_011480b0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_a08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_a00 = "";
  local_58.field_2._M_allocated_capacity._0_4_ = OneS._16_4_;
  local_58._M_dataplus._M_p._0_4_ = OneS._0_4_;
  local_58._M_dataplus._M_p._4_4_ = OneS._4_4_;
  local_58._M_string_length._0_4_ = OneS._8_4_;
  local_58._M_string_length._4_4_ = OneS._12_4_;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint160,uint160>
            (&local_f8,&local_a08,0x7d,1,2,&local_58,"uint160(OneS)",OneS,"OneS");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE( basics ) // constructors, equality, inequality
{
    // constructor uint256(vector<char>):
    BOOST_CHECK_EQUAL(R1L.ToString(), ArrayToString(R1Array,32));
    BOOST_CHECK_EQUAL(R1S.ToString(), ArrayToString(R1Array,20));
    BOOST_CHECK_EQUAL(R2L.ToString(), ArrayToString(R2Array,32));
    BOOST_CHECK_EQUAL(R2S.ToString(), ArrayToString(R2Array,20));
    BOOST_CHECK_EQUAL(ZeroL.ToString(), ArrayToString(ZeroArray,32));
    BOOST_CHECK_EQUAL(ZeroS.ToString(), ArrayToString(ZeroArray,20));
    BOOST_CHECK_EQUAL(OneL.ToString(), ArrayToString(OneArray,32));
    BOOST_CHECK_EQUAL(OneS.ToString(), ArrayToString(OneArray,20));
    BOOST_CHECK_EQUAL(MaxL.ToString(), ArrayToString(MaxArray,32));
    BOOST_CHECK_EQUAL(MaxS.ToString(), ArrayToString(MaxArray,20));
    BOOST_CHECK_NE(OneL.ToString(), ArrayToString(ZeroArray,32));
    BOOST_CHECK_NE(OneS.ToString(), ArrayToString(ZeroArray,20));

    // == and !=
    BOOST_CHECK_NE(R1L, R2L); BOOST_CHECK_NE(R1S, R2S);
    BOOST_CHECK_NE(ZeroL, OneL); BOOST_CHECK_NE(ZeroS, OneS);
    BOOST_CHECK_NE(OneL, ZeroL); BOOST_CHECK_NE(OneS, ZeroS);
    BOOST_CHECK_NE(MaxL, ZeroL); BOOST_CHECK_NE(MaxS, ZeroS);

    // String Constructor and Copy Constructor
    BOOST_CHECK_EQUAL(uint256S("0x"+R1L.ToString()), R1L);
    BOOST_CHECK_EQUAL(uint256S("0x"+R2L.ToString()), R2L);
    BOOST_CHECK_EQUAL(uint256S("0x"+ZeroL.ToString()), ZeroL);
    BOOST_CHECK_EQUAL(uint256S("0x"+OneL.ToString()), OneL);
    BOOST_CHECK_EQUAL(uint256S("0x"+MaxL.ToString()), MaxL);
    BOOST_CHECK_EQUAL(uint256S(R1L.ToString()), R1L);
    BOOST_CHECK_EQUAL(uint256S("   0x"+R1L.ToString()+"   "), R1L);
    BOOST_CHECK_EQUAL(uint256S("   0x"+R1L.ToString()+"-trash;%^&   "), R1L);
    BOOST_CHECK_EQUAL(uint256S("\t \n  \n \f\n\r\t\v\t   0x"+R1L.ToString()+"  \t \n  \n \f\n\r\t\v\t "), R1L);
    BOOST_CHECK_EQUAL(uint256S(""), ZeroL);
    BOOST_CHECK_EQUAL(uint256S("1"), OneL);
    BOOST_CHECK_EQUAL(R1L, uint256S(R1ArrayHex));
    BOOST_CHECK_EQUAL(uint256(R1L), R1L);
    BOOST_CHECK_EQUAL(uint256(ZeroL), ZeroL);
    BOOST_CHECK_EQUAL(uint256(OneL), OneL);

    BOOST_CHECK_EQUAL(uint160S("0x"+R1S.ToString()), R1S);
    BOOST_CHECK_EQUAL(uint160S("0x"+R2S.ToString()), R2S);
    BOOST_CHECK_EQUAL(uint160S("0x"+ZeroS.ToString()), ZeroS);
    BOOST_CHECK_EQUAL(uint160S("0x"+OneS.ToString()), OneS);
    BOOST_CHECK_EQUAL(uint160S("0x"+MaxS.ToString()), MaxS);
    BOOST_CHECK_EQUAL(uint160S(R1S.ToString()), R1S);
    BOOST_CHECK_EQUAL(uint160S("   0x"+R1S.ToString()+"   "), R1S);
    BOOST_CHECK_EQUAL(uint160S("   0x"+R1S.ToString()+"-trash;%^&   "), R1S);
    BOOST_CHECK_EQUAL(uint160S(" \t \n  \n \f\n\r\t\v\t  0x"+R1S.ToString()+"   \t \n  \n \f\n\r\t\v\t"), R1S);
    BOOST_CHECK_EQUAL(uint160S(""), ZeroS);
    BOOST_CHECK_EQUAL(R1S, uint160S(R1ArrayHex));

    BOOST_CHECK_EQUAL(uint160(R1S), R1S);
    BOOST_CHECK_EQUAL(uint160(ZeroS), ZeroS);
    BOOST_CHECK_EQUAL(uint160(OneS), OneS);
}